

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhosgPNGConv.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  char *__s1_00;
  Image img;
  Image local_60;
  Image local_38;
  
  if (argc < 2) {
    __s1_00 = (char *)0x0;
  }
  else {
    __s1_00 = argv[1];
  }
  if (argc < 3) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = argv[2];
  }
  if (argc < 4) {
    phosg::Image::Image(&local_38);
    if ((__s1_00 == (char *)0x0) || (iVar1 = strcmp(__s1_00,"-"), iVar1 == 0)) {
      phosg::Image::Image(&local_60,_stdin);
      phosg::Image::operator=(&local_38,&local_60);
    }
    else {
      phosg::Image::Image(&local_60,__s1_00);
      phosg::Image::operator=(&local_38,&local_60);
    }
    phosg::Image::~Image(&local_60);
    if ((__s1 == (char *)0x0) || (iVar1 = strcmp(__s1,"-"), iVar1 == 0)) {
      phosg::Image::save(&local_38,_stdout,PNG);
    }
    else {
      phosg::Image::save(&local_38,__s1,PNG);
    }
    phosg::Image::~Image(&local_38);
    return 0;
  }
  main_cold_1();
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  Image img;
  if (!src_filename || !strcmp(src_filename, "-")) {
    img = Image(stdin);
  } else {
    img = Image(src_filename);
  }

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    img.save(stdout, Image::Format::PNG);
  } else {
    img.save(dst_filename, Image::Format::PNG);
  }

  return 0;
}